

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prscomp.c
# Opt level: O0

void prsdel1(void *ctx0,toksdef *sym)

{
  ushort uVar1;
  uint len;
  char *pcVar2;
  errcxdef *in_RSI;
  char *in_RDI;
  uint label;
  prscxdef *ctx;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  
  uVar1 = *(ushort *)((long)&in_RSI->errcxptr + 2);
  len = (uint)uVar1;
  if ((*(byte *)(*(long *)(in_RDI + 0x28) + (ulong)*(ushort *)((long)&in_RSI->errcxptr + 2) * 6 +
                0x2a) & 1) == 0) {
    pcVar2 = errstr(in_RSI,in_RDI,len);
    *(char **)(**(long **)in_RDI + 0x18) = pcVar2;
    *(undefined4 *)(**(long **)in_RDI + 0x68) = 1;
    errlogn((errcxdef *)CONCAT44(len,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc,
            (char *)0x12875e);
    emtclbl((emtcxdef *)CONCAT44(len,in_stack_ffffffffffffffe0),
            (uint *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    *(short *)((long)&in_RSI->errcxptr + 2) = (short)len;
  }
  else {
    emtdlbl((emtcxdef *)(ulong)CONCAT24(uVar1,in_stack_ffffffffffffffe0),
            (uint *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    *(short *)((long)&in_RSI->errcxptr + 2) = (short)len;
  }
  return;
}

Assistant:

static void prsdel1(void *ctx0, toksdef *sym)
{
    prscxdef *ctx = (prscxdef *)ctx0;
    uint label;

    label = sym->toksval;
    if (!emtqset(ctx->prscxemt, sym->toksval))
    {
        errlog1(ctx->prscxerr, ERR_NOGOTO, ERRTSTR,
                errstr(ctx->prscxerr, sym->toksnam, sym->tokslen));
        emtclbl(ctx->prscxemt, &label);
        sym->toksval = label;
    }
    else
    {
        emtdlbl(ctx->prscxemt, &label);
        sym->toksval = label;
    }
}